

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O3

void __thiscall booster::shared_object::shared_object(shared_object *this,string *name)

{
  int iVar1;
  data *pdVar2;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pdVar2 = (data *)operator_new(8);
  pdVar2->handle = (void *)0x0;
  (this->d).ptr_ = pdVar2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  iVar1 = open(this,(char *)name,(int)&local_90,1);
  if ((char)iVar1 != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::operator+(&local_70,"booster::shared_object: failed to load shared library ",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_50,&local_b0,&local_90);
  runtime_error::runtime_error(this_00,&local_50);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

shared_object::shared_object(std::string const &name) : d(new data())
	{
		std::string err;
		if(!open(name,err)) {
			throw booster::runtime_error("booster::shared_object: failed to load shared library " + name +": " + err);
		}
	}